

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O0

sat_iterator
pstore::storage::slice_region_into_segments
          (shared_ptr<pstore::memory_mapper_base> *region,sat_iterator segment_it,
          sat_iterator segment_end)

{
  bool bVar1;
  element_type *peVar2;
  shared_ptr<void> *psVar3;
  element_type *peVar4;
  uint64_t uVar5;
  shared_ptr<void> local_78;
  sat_iterator local_68;
  sat_entry *segment;
  element_type *local_50;
  element_type *end;
  element_type *local_38;
  element_type *ptr;
  shared_ptr<void> data;
  sat_iterator segment_end_local;
  sat_iterator segment_it_local;
  shared_ptr<pstore::memory_mapper_base> *region_local;
  
  data.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)segment_end;
  peVar2 = std::
           __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)region);
  psVar3 = memory_mapper_base::data(peVar2);
  std::shared_ptr<void>::shared_ptr((shared_ptr<void> *)&ptr,psVar3);
  std::static_pointer_cast<unsigned_char,void>((shared_ptr<void> *)&end);
  peVar4 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2> *)&end);
  std::shared_ptr<unsigned_char>::~shared_ptr((shared_ptr<unsigned_char> *)&end);
  local_38 = peVar4;
  peVar2 = std::
           __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)region);
  uVar5 = memory_mapper_base::size(peVar2);
  local_50 = peVar4 + uVar5;
  segment_end_local = segment_it;
  while( true ) {
    if (local_50 <= local_38) {
      std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)&ptr);
      return segment_end_local;
    }
    if (segment_end_local ==
        (sat_iterator)data.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    break;
    local_68 = segment_end_local;
    bVar1 = std::operator==(&segment_end_local->value,(nullptr_t)0x0);
    if ((!bVar1) || (bVar1 = std::operator==(&local_68->region,(nullptr_t)0x0), !bVar1)) {
      assert_failed("segment.value == nullptr && segment.region == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                    ,0xb0);
    }
    std::shared_ptr<void>::shared_ptr<void>(&local_78,(shared_ptr<void> *)&ptr,local_38);
    std::shared_ptr<void>::operator=(&local_68->value,&local_78);
    std::shared_ptr<void>::~shared_ptr(&local_78);
    std::shared_ptr<pstore::memory_mapper_base>::operator=(&local_68->region,region);
    segment_end_local = segment_end_local + 1;
    local_38 = local_38 + 0x400000;
  }
  assert_failed("segment_it != segment_end",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                ,0xae);
}

Assistant:

auto storage::slice_region_into_segments (std::shared_ptr<memory_mapper_base> const & region,
                                              sat_iterator segment_it,
                                              sat_iterator const segment_end) -> sat_iterator {

        (void) segment_end; // silence unused argument warning in release build.
        std::shared_ptr<void> const data = region->data ();

        auto ptr = std::static_pointer_cast<std::uint8_t> (data).get ();
        auto const end = ptr + region->size ();
        for (; ptr < end; ptr += address::segment_size) {
            PSTORE_ASSERT (segment_it != segment_end);
            sat_entry & segment = *segment_it;
            PSTORE_ASSERT (segment.value == nullptr && segment.region == nullptr);

            // The segment's memory (at 'ptr') is managed by the 'data' shared_ptr.
            segment.value = std::shared_ptr<void> (data, ptr);
            segment.region = region;

            ++segment_it;
        }
        return segment_it;
    }